

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O0

void __thiscall btCompoundShape::removeChildShapeByIndex(btCompoundShape *this,int childShapeIndex)

{
  btDbvt *this_00;
  btCompoundShapeChild *pbVar1;
  int in_ESI;
  long in_RDI;
  int in_stack_00000028;
  
  *(int *)(in_RDI + 0x68) = *(int *)(in_RDI + 0x68) + 1;
  if (*(long *)(in_RDI + 0x60) != 0) {
    this_00 = *(btDbvt **)(in_RDI + 0x60);
    pbVar1 = btAlignedObjectArray<btCompoundShapeChild>::operator[]
                       ((btAlignedObjectArray<btCompoundShapeChild> *)(in_RDI + 0x20),in_ESI);
    btDbvt::remove(this_00,(char *)pbVar1->m_node);
  }
  btAlignedObjectArray<btCompoundShapeChild>::size
            ((btAlignedObjectArray<btCompoundShapeChild> *)(in_RDI + 0x20));
  btAlignedObjectArray<btCompoundShapeChild>::swap
            ((btAlignedObjectArray<btCompoundShapeChild> *)this,childShapeIndex,in_stack_00000028);
  if (*(long *)(in_RDI + 0x60) != 0) {
    pbVar1 = btAlignedObjectArray<btCompoundShapeChild>::operator[]
                       ((btAlignedObjectArray<btCompoundShapeChild> *)(in_RDI + 0x20),in_ESI);
    (pbVar1->m_node->field_2).dataAsInt = in_ESI;
  }
  btAlignedObjectArray<btCompoundShapeChild>::pop_back
            ((btAlignedObjectArray<btCompoundShapeChild> *)(in_RDI + 0x20));
  return;
}

Assistant:

void btCompoundShape::removeChildShapeByIndex(int childShapeIndex)
{
	m_updateRevision++;
	btAssert(childShapeIndex >=0 && childShapeIndex < m_children.size());
	if (m_dynamicAabbTree)
	{
		m_dynamicAabbTree->remove(m_children[childShapeIndex].m_node);
	}
	m_children.swap(childShapeIndex,m_children.size()-1);
    if (m_dynamicAabbTree) 
		m_children[childShapeIndex].m_node->dataAsInt = childShapeIndex;
	m_children.pop_back();

}